

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O1

int main(void)

{
  node *newest_node;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint depth;
  int iVar4;
  min_heap to_expand;
  Pyraminx myPyraminx;
  ofstream logfile;
  float local_2c0;
  priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare> local_2b8;
  value_type local_290;
  Pyraminx local_288;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_230);
  std::ofstream::open((char *)&local_230,0x109030);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"k, nodes expanded\n",0x12);
  std::ofstream::close();
  depth = 3;
  do {
    local_2c0 = 0.0;
    iVar4 = 0;
    do {
      Pyraminx::Pyraminx(&local_288);
      Pyraminx::scramble(&local_288,depth);
      printf("Solving puzzle randomized with %i moves...\n",(ulong)depth);
      Pyraminx::print(&local_288);
      iVar2 = Pyraminx::get_heuristic(&local_288);
      local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_290 = (value_type)operator_new(0x18);
      local_290->cost = iVar2;
      local_290->parent = (node *)0x0;
      std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::push
                (&local_2b8,&local_290);
      while (local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        newest_node = *local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
        std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::pop
                  (&local_2b8);
        iVar2 = apply_moves(newest_node,&local_288);
        bVar1 = Pyraminx::is_solved(&local_288);
        if (bVar1) {
          printf("Solved! Solution is: ");
          print_move_list(newest_node);
          free_nodes(&local_2b8);
          break;
        }
        enqueue_children(&local_2b8,newest_node,&local_288,iVar2);
        local_2c0 = local_2c0 + 1.0;
        undo_moves(newest_node,&local_288);
      }
      if (local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_288.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_288.yellow_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.yellow_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_288.red_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.red_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_288.blue_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.blue_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::~vector
                (&local_288.face_list);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 5);
    std::ofstream::open((char *)&local_230,0x109030);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,depth);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)(local_2c0 / 5.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::ofstream::close();
    depth = depth + 1;
    if (depth == 0x15) {
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      return 0;
    }
  } while( true );
}

Assistant:

int main(){
    // Open file to write out number of expanded nodes:
    std::ofstream logfile;
    logfile.open ("log.txt", std::ios::out | std::ios::app );
    logfile << "k, nodes expanded\n";
    logfile.close();

    int k_start = 3;
    int k_stop = 20;
    int num_instances = 5;
    // For each k, solve 5 puzzles randomized with k moves
    for(int k = k_start; k <= k_stop; k++){
        float count = 0;
        for(int i = 0; i < num_instances; i++){
            Pyraminx myPyraminx;
            myPyraminx.scramble(k);
            printf("Solving puzzle randomized with %i moves...\n", k);
            myPyraminx.print();

            // Create and enqueue root node
            int g = 0;
            int h = myPyraminx.get_heuristic();
            int f = g + h;
    
            min_heap to_expand;
            
            to_expand.push(new node(f));

            // Explore tree
            bool finished;
            while(!to_expand.empty()){
                node* current = to_expand.top();
                to_expand.pop();
                g = apply_moves(current, myPyraminx);
                finished = myPyraminx.is_solved();
                if(finished){
                    printf("Solved! Solution is: ");
                    print_move_list(*current);
                    free_nodes(to_expand);
                    break;
                }
                else{
                    count++;
                    enqueue_children(to_expand, current, myPyraminx, g);
                    undo_moves(current, myPyraminx);
                }
            }
        }// i for loop (5 instances)
        // We reopen and close the file each time because we don't want to lose
        // the data if termination is early
        logfile.open ("log.txt", std::ios::out | std::ios::app );
        float average = count / num_instances;
        logfile << k << ", " << average << "\n";
        logfile.close();
    }// k for loop (k from 3 to 20) 
}